

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  ImSpan<signed_char> *this;
  ImSpan<ImGuiTableColumn> *this_00;
  float fVar1;
  undefined1 auVar2 [16];
  char cVar3;
  char cVar4;
  ImU8 IVar5;
  byte bVar6;
  uint uVar7;
  ImGuiWindow *pIVar8;
  float fVar9;
  float fVar10;
  ImVec2 IVar11;
  undefined1 auVar12 [16];
  ImGuiContext *pIVar13;
  char cVar14;
  bool bVar15;
  bool bVar16;
  uint uVar17;
  ImGuiID id;
  char *pcVar18;
  ImGuiTableColumn *pIVar19;
  ImGuiTableColumn *pIVar20;
  byte *pbVar21;
  uint uVar22;
  ImGuiTableColumnIdx IVar23;
  bool bVar24;
  uint i;
  ulong uVar25;
  int column_n;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  int column_n_1;
  bool bVar29;
  float fVar30;
  undefined1 auVar32 [16];
  float fVar31;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  float fVar36;
  float fVar37;
  float local_ec;
  float local_e8;
  undefined1 local_c8 [16];
  float local_a8;
  undefined1 local_98 [48];
  ImRect host_clip_rect;
  ImRect local_40;
  undefined1 extraout_var [60];
  
  pIVar13 = GImGui;
  if (table->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x2ab,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  uVar22 = table->Flags & 0xe000;
  table->IsDefaultDisplayOrder = true;
  table->ColumnsEnabledCount = '\0';
  table->EnabledMaskByDisplayOrder = 0;
  table->EnabledMaskByIndex = 0;
  table->LeftMostEnabledColumn = -1;
  auVar33 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(pIVar13->Style).FramePadding.x)
                      );
  table->MinColumnWidth = auVar33._0_4_;
  this = &table->DisplayOrderToIndex;
  this_00 = &table->Columns;
  uVar17 = 0xffffffff;
  i = 0;
  local_c8 = ZEXT816(0);
  local_ec = 0.0;
  bVar16 = false;
  bVar24 = false;
  auVar33._12_4_ = 0;
  auVar33._0_12_ = local_98._4_12_;
  local_98._0_16_ = auVar33 << 0x20;
  cVar14 = '\0';
  while( true ) {
    uVar27 = table->ColumnsCount;
    if ((int)uVar27 <= (int)i) break;
    pcVar18 = ImSpan<signed_char>::operator[](this,i);
    cVar3 = *pcVar18;
    uVar27 = (uint)cVar3;
    if (i != uVar27) {
      table->IsDefaultDisplayOrder = false;
    }
    pIVar19 = ImSpan<ImGuiTableColumn>::operator[](this_00,uVar27);
    if (table->DeclColumnsCount <= cVar3) {
      TableSetupColumnFlags(table,pIVar19,0);
      pIVar19->NameOffset = -1;
      pIVar19->UserID = 0;
      pIVar19->InitStretchWeightOrWidth = -1.0;
    }
    uVar7 = table->Flags;
    if (((uVar7 & 4) == 0) || ((pIVar19->Flags & 0x40) != 0)) {
      pIVar19->IsEnabledNextFrame = true;
      bVar15 = true;
    }
    else {
      bVar15 = pIVar19->IsEnabledNextFrame;
    }
    if (pIVar19->IsEnabled == bVar15) {
      IVar23 = pIVar19->SortOrder;
    }
    else {
      pIVar19->IsEnabled = bVar15;
      table->IsSettingsDirty = true;
      IVar23 = pIVar19->SortOrder;
      if (IVar23 != -1 && (bVar15 & 1U) == 0) {
        table->IsSortSpecsDirty = true;
      }
    }
    if (((uVar7 >> 0x1a & 1) == 0) && ('\0' < IVar23)) {
      table->IsSortSpecsDirty = true;
    }
    if ((&pIVar19->WidthRequest)[(ulong)((pIVar19->Flags & 8) == 0) * 2] < 0.0) {
      pIVar19->AutoFitQueue = '\a';
      pIVar19->CannotSkipItemsQueue = '\a';
    }
    if ((bVar15 & 1U) == 0) {
      pIVar19->IndexWithinEnabledSet = -1;
    }
    else {
      pIVar19->PrevEnabledColumn = (ImGuiTableColumnIdx)uVar17;
      pIVar19->NextEnabledColumn = -1;
      if (uVar17 == 0xffffffff) {
        table->LeftMostEnabledColumn = cVar3;
      }
      else {
        pIVar20 = ImSpan<ImGuiTableColumn>::operator[](this_00,uVar17);
        pIVar20->NextEnabledColumn = cVar3;
      }
      cVar3 = table->ColumnsEnabledCount;
      table->ColumnsEnabledCount = cVar3 + '\x01';
      pIVar19->IndexWithinEnabledSet = cVar3;
      cVar4 = pIVar19->DisplayOrder;
      auVar33 = vpunpcklqdq_avx(ZEXT416((uint)(int)cVar4),ZEXT416(uVar27));
      auVar12._8_8_ = 1;
      auVar12._0_8_ = 1;
      auVar33 = vpsllvq_avx2(auVar12,auVar33);
      auVar2._0_8_ = table->EnabledMaskByDisplayOrder;
      auVar2._8_8_ = table->EnabledMaskByIndex;
      auVar33 = vpor_avx(auVar33,auVar2);
      table->EnabledMaskByDisplayOrder = auVar33._0_8_;
      table->EnabledMaskByIndex = auVar33._8_8_;
      if (cVar4 < cVar3) {
        __assert_fail("column->IndexWithinEnabledSet <= column->DisplayOrder",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                      ,0x2f3,"void ImGui::TableUpdateLayout(ImGuiTable *)");
      }
      if (pIVar19->IsPreserveWidthAuto == false) {
        fVar30 = TableGetColumnWidthAuto(table,pIVar19);
        pIVar19->WidthAuto = fVar30;
      }
      uVar7 = pIVar19->Flags;
      if ((uVar7 & 0x10) == 0) {
        bVar16 = true;
      }
      if ((((uVar7 & 8) != 0) && ((uVar7 & 0x10) != 0)) && (0.0 < pIVar19->InitStretchWeightOrWidth)
         ) {
        pIVar19->WidthAuto = pIVar19->InitStretchWeightOrWidth;
      }
      bVar24 = (bool)(bVar24 | pIVar19->AutoFitQueue != '\0');
      fVar30 = pIVar19->WidthAuto;
      uVar17 = uVar27;
      if ((uVar7 & 4) == 0) {
        auVar33 = vcmpss_avx(ZEXT416((uint)fVar30),local_c8,2);
        local_c8 = vblendvps_avx(ZEXT416((uint)fVar30),local_c8,auVar33);
        cVar14 = cVar14 + '\x01';
      }
      else {
        local_ec = local_ec + fVar30;
        local_98._0_4_ = local_98._0_4_ + 1;
      }
    }
    i = i + 1;
  }
  if ((((table->Flags & 8U) != 0) && (((uint)table->Flags >> 0x1b & 1) == 0)) &&
     (table->SortSpecsCount == '\0')) {
    table->IsSortSpecsDirty = true;
  }
  table->RightMostEnabledColumn = (ImGuiTableColumnIdx)uVar17;
  if ((table->LeftMostEnabledColumn < '\0') || ((uVar17 & 0x80) != 0)) {
    __assert_fail("table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x311,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  if (bVar24) {
    if (table->OuterWindow != table->InnerWindow) {
      table->InnerWindow->SkipItems = false;
    }
    table->IsSettingsDirty = true;
  }
  table->LeftMostStretchedColumn = -1;
  table->RightMostStretchedColumn = -1;
  local_a8 = 0.0;
  fVar30 = 0.0;
  for (uVar26 = 0; (long)uVar26 < (long)(int)uVar27; uVar26 = uVar26 + 1) {
    bVar6 = (byte)uVar26;
    if ((table->EnabledMaskByIndex >> (uVar26 & 0x3f) & 1) != 0) {
      pIVar19 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)uVar26);
      uVar17 = pIVar19->Flags;
      if ((uVar17 & 8) == 0) {
        if ((((uVar17 & 0x10) != 0) || (pIVar19->AutoFitQueue != '\0')) ||
           (fVar36 = pIVar19->StretchWeight, fVar36 < 0.0)) {
          if (uVar22 == 0x6000) {
            auVar33 = ZEXT416((uint)((pIVar19->WidthAuto / local_ec) * (float)(int)local_98._0_4_));
          }
          else {
            auVar33 = SUB6416(ZEXT464(0x3f800000),0);
          }
          auVar32 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)pIVar19->InitStretchWeightOrWidth),1
                              );
          auVar33 = vblendvps_avx(auVar33,ZEXT416((uint)pIVar19->InitStretchWeightOrWidth),auVar32);
          fVar36 = auVar33._0_4_;
          pIVar19->StretchWeight = fVar36;
        }
        if ((table->LeftMostStretchedColumn == -1) ||
           (pIVar20 = ImSpan<ImGuiTableColumn>::operator[]
                                (this_00,(int)table->LeftMostStretchedColumn),
           pIVar19->DisplayOrder < pIVar20->DisplayOrder)) {
          table->LeftMostStretchedColumn = bVar6;
        }
        local_a8 = local_a8 + fVar36;
        if ((table->RightMostStretchedColumn == -1) ||
           (pIVar20 = ImSpan<ImGuiTableColumn>::operator[]
                                (this_00,(int)table->RightMostStretchedColumn),
           pIVar20->DisplayOrder < pIVar19->DisplayOrder)) {
          table->RightMostStretchedColumn = bVar6;
        }
      }
      else {
        IVar5 = pIVar19->AutoFitQueue;
        auVar33 = local_c8;
        if (IVar5 == '\0') {
          auVar33 = ZEXT416((uint)pIVar19->WidthAuto);
        }
        auVar32 = local_c8;
        if ((uVar17 & 0x10) == 0) {
          auVar32 = auVar33;
        }
        if (uVar22 != 0x4000) {
          auVar32 = ZEXT416((uint)pIVar19->WidthAuto);
        }
        if (IVar5 == '\0') {
          if (((uVar17 & 0x10) != 0) &&
             ((table->RequestOutputMaskByIndex & 1L << (bVar6 & 0x3f)) != 0)) goto LAB_0018655f;
        }
        else {
          pIVar19->WidthRequest = auVar32._0_4_;
          if ((IVar5 != '\x01') &&
             ((table->IsInitializing == true && (pIVar19->IsPreserveWidthAuto == false)))) {
            auVar34 = ZEXT416((uint)(table->MinColumnWidth * 4.0));
            auVar33 = vcmpss_avx(auVar34,auVar32,2);
            auVar32 = vblendvps_avx(auVar34,auVar32,auVar33);
LAB_0018655f:
            pIVar19->WidthRequest = auVar32._0_4_;
          }
        }
        fVar30 = fVar30 + pIVar19->WidthRequest;
      }
      pIVar19->IsPreserveWidthAuto = false;
      fVar30 = table->CellPaddingX + table->CellPaddingX + fVar30;
      uVar27 = table->ColumnsCount;
    }
  }
  table->ColumnsEnabledFixedCount = cVar14;
  fVar36 = (table->WorkRect).Min.x;
  fVar9 = table->OuterPaddingX + table->OuterPaddingX +
          (table->CellSpacingX1 + table->CellSpacingX2) * (float)(table->ColumnsEnabledCount + -1);
  if ((((table->Flags & 0x1000000) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth)))
  {
    fVar37 = (table->WorkRect).Max.x - fVar36;
  }
  else {
    fVar37 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar1 = (table->WorkRect).Min.y;
  fVar30 = (fVar37 - fVar9) - fVar30;
  table->ColumnsGivenWidth =
       (table->CellPaddingX + table->CellPaddingX) * (float)(int)table->ColumnsEnabledCount + fVar9;
  local_e8 = fVar30;
  for (uVar26 = 0; (long)uVar26 < (long)(int)uVar27; uVar26 = uVar26 + 1) {
    if ((table->EnabledMaskByIndex >> (uVar26 & 0x3f) & 1) != 0) {
      pIVar19 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)uVar26);
      if ((pIVar19->Flags & 4U) != 0) {
        auVar32 = ZEXT416((uint)((pIVar19->StretchWeight / local_a8) * fVar30));
        auVar33 = vcmpss_avx(ZEXT416((uint)table->MinColumnWidth),auVar32,2);
        auVar33 = vblendvps_avx(ZEXT416((uint)table->MinColumnWidth),auVar32,auVar33);
        auVar33 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar33._0_4_ + 0.01)));
        pIVar19->WidthRequest = auVar33._0_4_;
        local_e8 = local_e8 - auVar33._0_4_;
      }
      if ((pIVar19->NextEnabledColumn == -1) && (table->LeftMostStretchedColumn != -1)) {
        pIVar19->Flags = pIVar19->Flags | 0x40000000;
      }
      auVar33 = vcmpss_avx(ZEXT416((uint)table->MinColumnWidth),ZEXT416((uint)pIVar19->WidthRequest)
                           ,2);
      auVar33 = vblendvps_avx(ZEXT416((uint)table->MinColumnWidth),
                              ZEXT416((uint)pIVar19->WidthRequest),auVar33);
      auVar32._0_4_ = (int)auVar33._0_4_;
      auVar32._4_4_ = (int)auVar33._4_4_;
      auVar32._8_4_ = (int)auVar33._8_4_;
      auVar32._12_4_ = (int)auVar33._12_4_;
      auVar33 = vcvtdq2ps_avx(auVar32);
      pIVar19->WidthGiven = auVar33._0_4_;
      table->ColumnsGivenWidth = auVar33._0_4_ + table->ColumnsGivenWidth;
      uVar27 = table->ColumnsCount;
    }
  }
  if (((1.0 <= local_e8) && ((table->Flags & 0x80000) == 0)) && (0.0 < local_a8)) {
    uVar26 = (ulong)uVar27;
    do {
      uVar25 = uVar26 & 0xffffffff;
      do {
        do {
          uVar26 = uVar26 - 1;
          if ((local_e8 < 1.0) || ((int)uVar25 < 1)) goto LAB_001867ea;
          uVar17 = (int)uVar25 - 1;
          uVar25 = (ulong)uVar17;
        } while ((table->EnabledMaskByDisplayOrder >> (uVar26 & 0x3f) & 1) == 0);
        pcVar18 = ImSpan<signed_char>::operator[](this,uVar17);
        pIVar19 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)*pcVar18);
      } while ((pIVar19->Flags & 4) == 0);
      pIVar19->WidthRequest = pIVar19->WidthRequest + 1.0;
      pIVar19->WidthGiven = pIVar19->WidthGiven + 1.0;
      local_e8 = local_e8 + -1.0;
    } while( true );
  }
LAB_001867ea:
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  local_40.Max.x = (table->OuterRect).Max.x;
  local_40.Min = (table->OuterRect).Min;
  auVar34._8_8_ = 0;
  auVar34._0_4_ = local_40.Min.x;
  auVar34._4_4_ = local_40.Min.y;
  auVar33 = vmovshdup_avx(auVar34);
  auVar32 = ZEXT416((uint)(auVar33._0_4_ + table->LastOuterHeight));
  auVar34 = ZEXT416((uint)(table->OuterRect).Max.y);
  auVar33 = vcmpss_avx(auVar32,auVar34,2);
  auVar33 = vblendvps_avx(auVar32,auVar34,auVar33);
  local_40.Max.y = auVar33._0_4_;
  iVar28 = 0;
  bVar15 = ItemHoverable(&local_40,0);
  bVar24 = '\0' < table->FreezeColumnsCount;
  fVar30 = fVar36;
  if ('\0' < table->FreezeColumnsCount) {
    fVar30 = (table->OuterRect).Min.x;
  }
  local_e8 = (fVar30 + table->OuterPaddingX) - table->CellSpacingX1;
  host_clip_rect.Min = (table->InnerClipRect).Min;
  host_clip_rect.Max = (table->InnerClipRect).Max;
  table->VisibleMaskByIndex = SUB168(ZEXT816(0) << 0x20,0);
  table->RequestOutputMaskByIndex = SUB168(ZEXT816(0) << 0x20,8);
  uVar26 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar26) {
      auVar32 = ZEXT416((uint)(table->WorkRect).Min.x);
      pIVar19 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)table->RightMostEnabledColumn);
      auVar34 = ZEXT416((uint)(pIVar19->ClipRect).Max.x);
      auVar33 = vcmpss_avx(auVar34,auVar32,2);
      auVar33 = vblendvps_avx(auVar34,auVar32,auVar33);
      fVar30 = auVar33._0_4_;
      if (((bVar15) && (table->HoveredColumnBody == -1)) && (fVar30 <= (pIVar13->IO).MousePos.x)) {
        table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
      }
      uVar17 = table->Flags;
      if (!bVar16 && (uVar17 & 1) != 0) {
        uVar17 = uVar17 & 0xfffffffe;
        table->Flags = uVar17;
      }
      if (table->RightMostStretchedColumn != -1) {
        uVar17 = uVar17 & 0xfffeffff;
        table->Flags = uVar17;
      }
      if ((uVar17 >> 0x10 & 1) != 0) {
        (table->WorkRect).Max.x = fVar30;
        (table->OuterRect).Max.x = fVar30;
        auVar33 = vminss_avx(ZEXT416((uint)(table->InnerClipRect).Max.x),auVar33);
        (table->InnerClipRect).Max.x = auVar33._0_4_;
      }
      pIVar8 = table->InnerWindow;
      IVar11 = (table->WorkRect).Max;
      (pIVar8->ParentWorkRect).Min = (table->WorkRect).Min;
      (pIVar8->ParentWorkRect).Max = IVar11;
      fVar30 = (table->InnerClipRect).Max.x;
      table->BorderX1 = (table->InnerClipRect).Min.x;
      table->BorderX2 = fVar30;
      TableSetupDrawChannels(table);
      if ((table->Flags & 1) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if ((table->IsContextPopupOpen == true) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        bVar16 = BeginPopupEx(id,0x141);
        if (bVar16) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      uVar17 = table->Flags;
      if (((byte)((uVar17 & 8) >> 3) & table->IsSortSpecsDirty) == 1) {
        TableSortSpecsBuild(table);
        uVar17 = table->Flags;
      }
      pIVar8 = table->InnerWindow;
      if ((uVar17 >> 0x14 & 1) == 0) {
        ImDrawList::PushClipRect
                  (pIVar8->DrawList,(pIVar8->ClipRect).Min,(pIVar8->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar8->DrawList,2);
      }
      return;
    }
    pbVar21 = (byte *)ImSpan<signed_char>::operator[](this,(int)uVar26);
    bVar6 = *pbVar21;
    pIVar19 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)(char)bVar6);
    bVar29 = true;
    if (table->FreezeRowsCount < '\x01') {
      bVar29 = (char)bVar6 < table->FreezeColumnsCount;
    }
    pIVar19->NavLayerCurrent = bVar29;
    if (bVar24) {
      bVar24 = true;
      if (iVar28 == table->FreezeColumnsCount) {
        local_e8 = local_e8 + (fVar36 - (table->OuterRect).Min.x);
        goto LAB_00186927;
      }
    }
    else {
LAB_00186927:
      bVar24 = false;
    }
    pbVar21 = (byte *)((long)&pIVar19->Flags + 2);
    *pbVar21 = *pbVar21 & 0xf;
    if ((table->EnabledMaskByDisplayOrder >> (uVar26 & 0x3f) & 1) == 0) {
      (pIVar19->ClipRect).Max.x = local_e8;
      (pIVar19->ClipRect).Min.x = local_e8;
      pIVar19->WorkMinX = local_e8;
      pIVar19->MaxX = local_e8;
      pIVar19->MinX = local_e8;
      pIVar19->WidthGiven = 0.0;
      (pIVar19->ClipRect).Min.y = fVar1;
      (pIVar19->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar19->ClipRect,&host_clip_rect);
      pIVar19->IsVisibleX = false;
      pIVar19->IsVisibleY = false;
      pIVar19->IsRequestOutput = false;
      pIVar19->IsSkipItems = true;
      pIVar19->ItemWidth = 1.0;
    }
    else {
      if (((bVar15) && (fVar30 = (pIVar13->IO).MousePos.x, (pIVar19->ClipRect).Min.x <= fVar30)) &&
         (fVar30 < (pIVar19->ClipRect).Max.x)) {
        table->HoveredColumnBody = bVar6;
      }
      pIVar19->MinX = local_e8;
      auVar35._0_4_ = TableGetMaxColumnWidth(table,(int)(char)bVar6);
      auVar35._4_60_ = extraout_var;
      auVar32 = vminss_avx(ZEXT416((uint)pIVar19->WidthGiven),auVar35._0_16_);
      auVar34 = vminss_avx(ZEXT416((uint)pIVar19->WidthRequest),ZEXT416((uint)table->MinColumnWidth)
                          );
      auVar33 = vcmpss_avx(auVar34,auVar32,2);
      auVar33 = vblendvps_avx(auVar34,auVar32,auVar33);
      fVar31 = auVar33._0_4_;
      pIVar19->WidthGiven = fVar31;
      fVar30 = table->CellPaddingX;
      fVar9 = table->CellSpacingX1;
      fVar37 = table->CellSpacingX2;
      fVar10 = fVar30 + fVar30 + fVar37 + fVar9 + fVar31 + local_e8;
      pIVar19->MaxX = fVar10;
      pIVar19->WorkMinX = fVar9 + fVar30 + pIVar19->MinX;
      pIVar19->WorkMaxX = (fVar10 - fVar30) - fVar37;
      auVar33 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar31 * 0.65)));
      pIVar19->ItemWidth = auVar33._0_4_;
      (pIVar19->ClipRect).Min.x = pIVar19->MinX;
      (pIVar19->ClipRect).Min.y = fVar1;
      (pIVar19->ClipRect).Max.x = fVar10;
      (pIVar19->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar19->ClipRect,&host_clip_rect);
      fVar30 = (pIVar19->ClipRect).Min.x;
      fVar9 = (pIVar19->ClipRect).Max.x;
      pIVar19->IsVisibleX = fVar30 < fVar9;
      pIVar19->IsVisibleY = true;
      if (fVar9 <= fVar30) {
        if (pIVar19->AutoFitQueue != '\0') goto LAB_00186b1d;
        bVar29 = pIVar19->CannotSkipItemsQueue != '\0';
        pIVar19->IsRequestOutput = bVar29;
        if (bVar29) goto LAB_00186b23;
      }
      else {
        table->VisibleMaskByIndex = table->VisibleMaskByIndex | 1L << (bVar6 & 0x3f);
LAB_00186b1d:
        pIVar19->IsRequestOutput = true;
LAB_00186b23:
        table->RequestOutputMaskByIndex = table->RequestOutputMaskByIndex | 1L << (bVar6 & 0x3f);
      }
      bVar29 = true;
      if (pIVar19->IsEnabled == true) {
        bVar29 = table->HostSkipItems;
      }
      pIVar19->IsSkipItems = bVar29;
      if (bVar29 == true && fVar30 < fVar9) {
        __assert_fail("!is_visible",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                      ,0x3e1,"void ImGui::TableUpdateLayout(ImGuiTable *)");
      }
      uVar17 = (uint)(fVar30 < fVar9) << 0x15 | pIVar19->Flags;
      uVar22 = uVar17 | 0x100000;
      pIVar19->Flags = uVar22;
      if (pIVar19->SortOrder != -1) {
        uVar22 = uVar17 | 0x500000;
        pIVar19->Flags = uVar22;
      }
      if (table->HoveredColumnBody == bVar6) {
        pIVar19->Flags = uVar22 | 0x800000;
      }
      fVar30 = pIVar19->WorkMinX;
      pIVar19->ContentMaxXFrozen = fVar30;
      pIVar19->ContentMaxXUnfrozen = fVar30;
      pIVar19->ContentMaxXHeadersUsed = fVar30;
      pIVar19->ContentMaxXHeadersIdeal = fVar30;
      if (table->HostSkipItems == false) {
        pIVar19->AutoFitQueue = pIVar19->AutoFitQueue >> 1;
        pIVar19->CannotSkipItemsQueue = pIVar19->CannotSkipItemsQueue >> 1;
      }
      if (iVar28 < table->FreezeColumnsCount) {
        auVar33 = ZEXT416((uint)(pIVar19->MaxX + 1.0));
        auVar32 = vminss_avx(ZEXT416((uint)host_clip_rect.Max.x),auVar33);
        auVar33 = vcmpss_avx(auVar33,ZEXT416((uint)host_clip_rect.Min.x),1);
        auVar33 = vblendvps_avx(auVar32,ZEXT416((uint)host_clip_rect.Min.x),auVar33);
        host_clip_rect.Min.x = auVar33._0_4_;
      }
      local_e8 = local_e8 +
                 table->CellPaddingX + table->CellPaddingX +
                 pIVar19->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2;
      iVar28 = iVar28 + 1;
    }
    uVar26 = uVar26 + 1;
  } while( true );
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->LeftMostEnabledColumn = -1;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int prev_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings/sortspecs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsEnabledNextFrame = true;
        if (column->IsEnabled != column->IsEnabledNextFrame)
        {
            column->IsEnabled = column->IsEnabledNextFrame;
            table->IsSettingsDirty = true;
            if (!column->IsEnabled && column->SortOrder != -1)
                table->IsSortSpecsDirty = true;
        }
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (prev_visible_column_idx != -1)
            table->Columns[prev_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        else
            table->LeftMostEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        prev_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)prev_visible_column_idx;
    IM_ASSERT(table->LeftMostEnabledColumn >= 0 && table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto; 

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->Flags &= ~ImGuiTableFlags_NoHostExtendX;
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}